

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

VarStatus __thiscall soplex::SoPlexBase<double>::basisRowStatus(SoPlexBase<double> *this,int row)

{
  bool bVar1;
  int iVar2;
  VarStatus *pVVar3;
  int in_ESI;
  SoPlexBase<double> *in_RDI;
  int row_00;
  VarStatus local_4;
  
  bVar1 = hasBasis(in_RDI);
  if (((bVar1) && (-1 < in_ESI)) &&
     (row_00 = in_ESI, iVar2 = numRows((SoPlexBase<double> *)0x4250ab), row_00 < iVar2)) {
    if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
      pVVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (&in_RDI->_basisStatusRows,in_ESI);
      local_4 = *pVVar3;
    }
    else {
      local_4 = SPxSolverBase<double>::getBasisRowStatus((SPxSolverBase<double> *)in_RDI,row_00);
    }
  }
  else {
    local_4 = BASIC;
  }
  return local_4;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisRowStatus(int row) const
{
   assert(row >= 0);
   assert(row < numRows());

   // if no basis is available, return slack basis; if index is out of range, return basic status as for a newly
   // added row
   if(!hasBasis() || row < 0 || row >= numRows())
      return SPxSolverBase<R>::BASIC;
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisRowStatus(row);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(row < _basisStatusRows.size());
      return _basisStatusRows[row];
   }
}